

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O0

REF_STATUS
ref_search_gather(REF_SEARCH ref_search,REF_LIST ref_list,REF_INT parent,REF_DBL *position,
                 REF_DBL radius)

{
  uint uVar1;
  double dVar2;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL distance;
  REF_INT i;
  REF_DBL radius_local;
  REF_DBL *position_local;
  REF_INT parent_local;
  REF_LIST ref_list_local;
  REF_SEARCH ref_search_local;
  
  if (ref_search->n == 0) {
    ref_search_local._4_4_ = 0;
  }
  else if (parent == -1) {
    ref_search_local._4_4_ = 0;
  }
  else if ((parent < 0) || (ref_search->n <= parent)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0xc6,
           "ref_search_gather","parent invalid");
    printf("%d n %d parent\n",(ulong)(uint)ref_search->n,(ulong)(uint)parent);
    ref_search_local._4_4_ = 1;
  }
  else if (ref_search->item[parent] == -1) {
    ref_search_local._4_4_ = 0;
  }
  else {
    _ref_private_macro_code_rss_1 = 0.0;
    for (distance._4_4_ = 0; distance._4_4_ < ref_search->d; distance._4_4_ = distance._4_4_ + 1) {
      dVar2 = pow(position[distance._4_4_] -
                  ref_search->pos[distance._4_4_ + ref_search->d * parent],2.0);
      _ref_private_macro_code_rss_1 = dVar2 + _ref_private_macro_code_rss_1;
    }
    dVar2 = sqrt(_ref_private_macro_code_rss_1);
    if ((ref_search->radius[parent] + radius < dVar2) ||
       (ref_search_local._4_4_ = ref_list_push(ref_list,ref_search->item[parent]),
       ref_search_local._4_4_ == 0)) {
      if (dVar2 - radius <= ref_search->children_ball[parent]) {
        uVar1 = ref_search_gather(ref_search,ref_list,ref_search->left[parent],position,radius);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
                 0xda,"ref_search_gather",(ulong)uVar1,"gthr");
          return uVar1;
        }
        uVar1 = ref_search_gather(ref_search,ref_list,ref_search->right[parent],position,radius);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
                 0xdd,"ref_search_gather",(ulong)uVar1,"gthr");
          return uVar1;
        }
      }
      ref_search_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0xd2
             ,"ref_search_gather",(ulong)ref_search_local._4_4_,"add item");
    }
  }
  return ref_search_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_search_gather(REF_SEARCH ref_search,
                                            REF_LIST ref_list, REF_INT parent,
                                            REF_DBL *position, REF_DBL radius) {
  REF_INT i;
  REF_DBL distance;

  if (0 == ref_search->n) return REF_SUCCESS;  /* tree empty */
  if (REF_EMPTY == parent) return REF_SUCCESS; /* finished traversing */
  RAB(0 <= parent && parent < ref_search->n, "parent invalid",
      { printf("%d n %d parent\n", ref_search->n, parent); })
  /* finished traversing */
  if (REF_EMPTY == ref_search->item[parent]) return REF_SUCCESS;

  distance = 0.0;
  for (i = 0; i < ref_search->d; i++)
    distance +=
        pow(position[i] - ref_search->pos[i + ref_search->d * parent], 2);
  distance = sqrt(distance);

  /* if the distance between me and the target are less than combined radii */
  if (distance <= ref_search->radius[parent] + radius) {
    RSS(ref_list_push(ref_list, ref_search->item[parent]), "add item");
  }

  /* if the distance between me and the target are less than children
   * children_ball includes child radii, so only subtract target radius */
  if (distance - radius <= ref_search->children_ball[parent]) {
    RSS(ref_search_gather(ref_search, ref_list, ref_search->left[parent],
                          position, radius),
        "gthr");
    RSS(ref_search_gather(ref_search, ref_list, ref_search->right[parent],
                          position, radius),
        "gthr");
  }

  return REF_SUCCESS;
}